

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.h
# Opt level: O2

void __thiscall tok_embed_ctx::end_expr(tok_embed_ctx *this)

{
  int iVar1;
  tok_embed_level *ptVar2;
  
  iVar1 = this->level;
  if (0 < iVar1) {
    iVar1 = iVar1 + -1;
    this->level = iVar1;
  }
  if (iVar1 == 0) {
    ptVar2 = (tok_embed_level *)0x0;
  }
  else {
    if (9 < iVar1) {
      return;
    }
    ptVar2 = this->stk + (long)iVar1 + -1;
  }
  this->s = ptVar2;
  return;
}

Assistant:

void end_expr()
    {
        if (level > 0)
            --level;
        if (level == 0)
            s = 0;
		else if (level < (int)countof(stk))
            s = stk + level - 1;
    }